

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementCableANCF::EvaluateSectionFrame
          (ChElementCableANCF *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer psVar8;
  element_type *peVar9;
  element_type *peVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ShapeVector N;
  ChMatrix33<double> msect;
  undefined1 local_100 [16];
  double local_f0;
  undefined8 local_e0;
  double local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  ChQuaternion<double> local_b8;
  ChMatrix33<double> local_98;
  
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1b]
  )(this,&local_e0);
  psVar8 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar17._8_8_ = local_e0;
  auVar17._0_8_ = local_e0;
  peVar9 = (psVar8->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar10 = psVar8[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  dVar11 = *(double *)&(peVar9->super_ChNodeFEAxyz).field_0xf0;
  dVar12 = *(double *)&peVar9->field_0xf8;
  auVar5 = *(undefined1 (*) [16])&(peVar9->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
  dVar1 = *(double *)&peVar9->field_0x100;
  uVar2 = *(ulong *)&(peVar9->super_ChNodeFEAxyz).field_0x30;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar2;
  auVar6 = *(undefined1 (*) [16])&(peVar10->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
  uVar3 = *(ulong *)&(peVar10->super_ChNodeFEAxyz).field_0x30;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar3;
  uVar4 = *(ulong *)&peVar10->field_0x100;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar4;
  auVar7 = *(undefined1 (*) [16])&(peVar10->super_ChNodeFEAxyz).field_0xf0;
  auVar15._0_8_ = dVar11 * local_d8;
  auVar15._8_8_ = dVar12 * local_d8;
  auVar15 = vfmadd231pd_fma(auVar15,auVar17,auVar5);
  auVar19._8_8_ = local_d0;
  auVar19._0_8_ = local_d0;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1 * local_d8;
  auVar13 = vfmadd231sd_fma(auVar13,auVar24,auVar17);
  auVar15 = vfmadd231pd_fma(auVar15,auVar19,auVar6);
  auVar21._8_8_ = local_c8;
  auVar21._0_8_ = local_c8;
  auVar13 = vfmadd231sd_fma(auVar13,auVar25,auVar19);
  auVar15 = vfmadd231pd_fma(auVar15,auVar21,auVar7);
  auVar13 = vfmadd231sd_fma(auVar13,auVar23,auVar21);
  *(undefined1 (*) [16])point->m_data = auVar15;
  point->m_data[2] = auVar13._0_8_;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1c]
  )((eta + 1.0) * 0.5,this,&local_e0);
  auVar18._8_8_ = local_e0;
  auVar18._0_8_ = local_e0;
  auVar20._8_8_ = local_d0;
  auVar20._0_8_ = local_d0;
  auVar22._8_8_ = local_c8;
  auVar22._0_8_ = local_c8;
  auVar16._0_8_ = local_d8 * dVar11;
  auVar16._8_8_ = local_d8 * dVar12;
  auVar15 = vfmadd231pd_fma(auVar16,auVar18,auVar5);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_d8 * dVar1;
  auVar13 = vfmadd231sd_fma(auVar14,auVar18,auVar5);
  auVar5 = vfmadd231pd_fma(auVar15,auVar20,auVar6);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar6 = vfmadd231sd_fma(auVar13,auVar20,auVar6);
  local_100 = vfmadd231pd_fma(auVar5,auVar22,auVar7);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar4;
  auVar5 = vfmadd231sd_fma(auVar6,auVar22,auVar7);
  local_f0 = auVar5._0_8_;
  ChVector<double>::Normalize((ChVector<double> *)local_100);
  ChMatrix33<double>::Set_A_Xdir
            (&local_98,(ChVector<double> *)local_100,(ChVector<double> *)&VECT_Y);
  ChMatrix33<double>::Get_A_quaternion(&local_b8,&local_98);
  ChQuaternion<double>::operator=(rot,&local_b8);
  return;
}

Assistant:

void ChElementCableANCF::EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) {
    ChVector<> u_displ;
    ChVector<> u_rotaz;

    double xi = (eta + 1.0) * 0.5;  // because ShapeFunctions() works in 0..1 range
    ShapeVector N;
    ShapeFunctions(N, xi);

    ChVector<> pA = this->nodes[0]->GetPos();
    ChVector<> dA = this->nodes[0]->GetD();
    ChVector<> pB = this->nodes[1]->GetPos();
    ChVector<> dB = this->nodes[1]->GetD();

    point.x() = N(0) * pA.x() + N(1) * dA.x() + N(2) * pB.x() + N(3) * dB.x();
    point.y() = N(0) * pA.y() + N(1) * dA.y() + N(2) * pB.y() + N(3) * dB.y();
    point.z() = N(0) * pA.z() + N(1) * dA.z() + N(2) * pB.z() + N(3) * dB.z();

    this->ShapeFunctionsDerivatives(N, xi);

    ChVector<> Dx;

    Dx.x() = N(0) * pA.x() + N(1) * dA.x() + N(2) * pB.x() + N(3) * dB.x();
    Dx.y() = N(0) * pA.y() + N(1) * dA.y() + N(2) * pB.y() + N(3) * dB.y();
    Dx.z() = N(0) * pA.z() + N(1) * dA.z() + N(2) * pB.z() + N(3) * dB.z();

    // This element has no torsional dof, so once we have the Dx direction
    // of the line, we must compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization , where we propose a guess direction
    // VECT_Y for the vertical:
    ChMatrix33<> msect;
    Dx.Normalize();
    msect.Set_A_Xdir(Dx, VECT_Y);

    rot = msect.Get_A_quaternion();
}